

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BlockArrayIndexingCaseInstance *this)

{
  undefined1 *this_00;
  allocator<vk::VkDescriptorBufferInfo> *this_01;
  int iVar1;
  value_type vVar2;
  ShaderType shaderType;
  ShaderSpec *shaderSpec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  ulong uVar3;
  bool bVar4;
  qpTestResult qVar5;
  TestContext *this_03;
  DeviceInterface *vk;
  size_type sVar6;
  Buffer *pBVar7;
  reference pvVar8;
  const_reference pvVar9;
  value_type *pvVar10;
  const_reference pvVar11;
  Handle<(vk::HandleType)21> *pHVar12;
  Handle<(vk::HandleType)22> *pHVar13;
  VkBuffer VVar14;
  reference pvVar15;
  reference __first;
  Handle<(vk::HandleType)19> *pHVar16;
  ShaderExecutor *pSVar17;
  reference ppvVar18;
  reference pvVar19;
  MessageBuilder *pMVar20;
  VkDescriptorType descriptorType_00;
  Context *pCVar21;
  Buffer *in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  reference local_700;
  allocator<char> local_631;
  string local_630;
  TestStatus local_610;
  Hex<8UL> local_5e8;
  Hex<8UL> local_5e0;
  MessageBuilder local_5d8;
  value_type local_458;
  value_type local_454;
  deUint32 resValue;
  deUint32 refValue;
  int readNdx_3;
  int invocationNdx;
  DefaultDeleter<vkt::shaderexecutor::ShaderExecutor> local_439;
  deUint64 local_438;
  undefined1 local_430 [8];
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  executor;
  int local_414;
  reference pvStack_410;
  int readNdx_2;
  int local_404;
  reference pvStack_400;
  int readNdx_1;
  int *dst;
  undefined4 local_3f0;
  int readNdx;
  VkWriteDescriptorSet descriptorWrite_1;
  VkDescriptorBufferInfo bufferInfo;
  ulong local_390;
  size_t ndx;
  VkWriteDescriptorSet descriptorWrite;
  undefined1 local_340 [8];
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> bufferInfos;
  RefData<vk::Handle<(vk::HandleType)22>_> local_308;
  undefined1 local_2e8 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  RefData<vk::Handle<(vk::HandleType)21>_> local_2a0;
  undefined1 local_280 [8];
  VkDescriptorPoolCreateInfo poolInfo;
  VkDescriptorPoolSize poolSizes [2];
  RefData<vk::Handle<(vk::HandleType)19>_> local_228;
  undefined1 local_208 [8];
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  VkDescriptorSetLayoutBinding bindings [2];
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_1b0;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  *local_1a0;
  SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer> local_190;
  ulong local_180;
  size_t bufferNdx;
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  undefined1 local_100 [8];
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  buffers;
  VkDevice device;
  DeviceInterface *vkd;
  VkDescriptorType descriptorType;
  VkBufferUsageFlags bufferUsage;
  vector<void_*,_std::allocator<void_*>_> outputs;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  string local_80;
  byte local_59;
  TestLog *local_58;
  TestLog *log;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  int numReads;
  int numInvocations;
  BlockArrayIndexingCaseInstance *this_local;
  TestStatus *testResult;
  
  outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x20;
  outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0x80,&local_39);
  std::allocator<unsigned_int>::~allocator(&local_39);
  this_03 = Context::getTestContext
                      ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  local_58 = tcu::TestContext::getLog(this_03);
  local_59 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Pass",
             (allocator<char> *)
             ((long)&expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  tcu::TestStatus::pass(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)&descriptorType);
  iVar1 = *(int *)&(this->super_OpaqueTypeIndexingTestInstance).field_0x34;
  descriptorType_00 =
       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER -
       (*(int *)&(this->super_OpaqueTypeIndexingTestInstance).field_0x34 == 0);
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  buffers.
  super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                                   m_context);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  this_00 = &indexBuffer.
             super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             .m_data.field_0xf;
  std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>::allocator
            ((allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_> *)
             this_00);
  std::
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  ::vector((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
            *)local_100,sVar6,(allocator_type *)this_00);
  std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>::~allocator
            ((allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_> *)
             &indexBuffer.
              super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              .m_data.field_0xf);
  de::details::
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  ::MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx);
  OpaqueTypeIndexingTestInstance::checkSupported
            (&this->super_OpaqueTypeIndexingTestInstance,descriptorType_00);
  for (local_180 = 0; uVar3 = local_180,
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues),
      uVar3 < sVar6; local_180 = local_180 + 1) {
    pBVar7 = (Buffer *)operator_new(0x40);
    anon_unknown_0::Buffer::Buffer
              (pBVar7,(this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
               (uint)(iVar1 != 0) * 0x10 + 0x10,4);
    de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::SharedPtr(&local_190,pBVar7);
    pvVar8 = std::
             vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           *)local_100,local_180);
    de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::operator=(pvVar8,&local_190);
    de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::~SharedPtr(&local_190);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this->m_inValues,local_180);
    vVar2 = *pvVar9;
    pvVar8 = std::
             vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           *)local_100,local_180);
    pBVar7 = de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::operator->(pvVar8);
    pvVar10 = (value_type *)anon_unknown_0::Buffer::getHostPtr(pBVar7);
    *pvVar10 = vVar2;
    pvVar8 = std::
             vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           *)local_100,local_180);
    pBVar7 = de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::operator->(pvVar8);
    anon_unknown_0::Buffer::flush(pBVar7);
  }
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    pCVar21 = (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](this->m_readIndices,0);
    createUniformIndexBuffer
              ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)&local_1b0,pCVar21,4,pvVar11);
    local_1a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1b0,(MovePtr *)pCVar21);
    data._8_8_ = in_stack_fffffffffffff870;
    data.ptr = in_stack_fffffffffffff868;
    de::details::
    MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::operator=((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                 *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                    deleter.m_allocator,data);
    de::details::
    MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::~MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)&local_1b0);
  }
  layoutInfo.pBindings._0_4_ = 0;
  layoutInfo.pBindings._4_4_ = descriptorType_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  local_208._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  layoutInfo._4_4_ = 0;
  layoutInfo.pNext._0_4_ = 0;
  layoutInfo.pNext._4_4_ = 2;
  layoutInfo._16_8_ = &layoutInfo.pBindings;
  ::vk::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)(poolSizes + 1),vk,
             (VkDevice)
             buffers.
             super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkDescriptorSetLayoutCreateInfo *)local_208,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_228,(Move *)(poolSizes + 1));
  data_00.deleter.m_deviceIface = local_228.deleter.m_deviceIface;
  data_00.object.m_internal = local_228.object.m_internal;
  data_00.deleter.m_device = local_228.deleter.m_device;
  data_00.deleter.m_allocator = local_228.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)(poolSizes + 1));
  poolInfo.pPoolSizes._0_4_ = descriptorType_00;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  poolInfo.pPoolSizes._4_4_ = (undefined4)sVar6;
  poolSizes[0].type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  poolSizes[0].descriptorCount = 1;
  local_280._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  poolInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  poolInfo._4_4_ = 0;
  poolInfo.pNext._0_4_ = 1;
  poolInfo.pNext._4_4_ = 1;
  poolInfo.flags = 2;
  poolInfo._24_8_ = &poolInfo.pPoolSizes;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts,vk,
             (VkDevice)
             buffers.
             super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkDescriptorPoolCreateInfo *)local_280,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a0,(Move *)&allocInfo.pSetLayouts);
  data_01.deleter.m_deviceIface = local_2a0.deleter.m_deviceIface;
  data_01.object.m_internal = local_2a0.object.m_internal;
  data_01.deleter.m_device = local_2a0.deleter.m_device;
  data_01.deleter.m_allocator = local_2a0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts);
  local_2e8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)
                       &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                        deleter.m_pool);
  allocInfo.pNext = (void *)pHVar12->m_internal;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)
                  &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                   deleter.m_allocator);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &bufferInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,vk,
             (VkDevice)
             buffers.
             super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkDescriptorSetAllocateInfo *)local_2e8);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_308,
             (Move *)&bufferInfos.
                      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_02.deleter.m_deviceIface = local_308.deleter.m_deviceIface;
  data_02.object.m_internal = local_308.object.m_internal;
  data_02.deleter.m_device = local_308.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_308.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &bufferInfos.
              super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  this_01 = (allocator<vk::VkDescriptorBufferInfo> *)((long)&descriptorWrite.pTexelBufferView + 7);
  std::allocator<vk::VkDescriptorBufferInfo>::allocator(this_01);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_340,sVar6,this_01);
  std::allocator<vk::VkDescriptorBufferInfo>::~allocator
            ((allocator<vk::VkDescriptorBufferInfo> *)((long)&descriptorWrite.pTexelBufferView + 7))
  ;
  ndx._0_4_ = 0x23;
  descriptorWrite.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorWrite._4_4_ = 0;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx);
  descriptorWrite.pNext = (void *)pHVar13->m_internal;
  descriptorWrite.dstSet.m_internal._0_4_ = 0;
  descriptorWrite.dstSet.m_internal._4_4_ = 0;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
  descriptorWrite.dstBinding = (deUint32)sVar6;
  descriptorWrite.descriptorCount = 0;
  descriptorWrite.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  descriptorWrite.dstArrayElement = descriptorType_00;
  descriptorWrite.pImageInfo =
       (VkDescriptorImageInfo *)
       std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
       operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *
                  )local_340,0);
  descriptorWrite.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  for (local_390 = 0;
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues),
      local_390 < sVar6; local_390 = local_390 + 1) {
    pvVar8 = std::
             vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                           *)local_100,local_390);
    pBVar7 = de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::operator->(pvVar8);
    VVar14 = anon_unknown_0::Buffer::getBuffer(pBVar7);
    pvVar15 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
              operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          *)local_340,local_390);
    (pvVar15->buffer).m_internal = VVar14.m_internal;
    pvVar15 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
              operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          *)local_340,local_390);
    pvVar15->offset = 0;
    pvVar15 = std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
              operator[]((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          *)local_340,local_390);
    pvVar15->range = 0xffffffffffffffff;
  }
  (*vk->_vptr_DeviceInterface[0x3e])
            (vk,buffers.
                super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,1,&ndx,0,0);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::~vector
            ((vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> *)
             local_340);
  bVar4 = de::details::UniqueBase::operator_cast_to_bool
                    ((UniqueBase *)
                     &extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      deleter.m_allocator);
  if (bVar4) {
    pBVar7 = de::details::
             UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             ::operator->((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                           *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                              m_data.deleter.m_allocator);
    descriptorWrite_1.pTexelBufferView = (VkBufferView *)anon_unknown_0::Buffer::getBuffer(pBVar7);
    local_3f0 = 0x23;
    descriptorWrite_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    descriptorWrite_1._4_4_ = 0;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx);
    descriptorWrite_1.pNext = (void *)pHVar13->m_internal;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this->m_inValues);
    descriptorWrite_1.dstSet.m_internal._0_4_ = (undefined4)sVar6;
    descriptorWrite_1.dstSet.m_internal._4_4_ = 0;
    descriptorWrite_1.dstBinding = 1;
    descriptorWrite_1.dstArrayElement = 6;
    descriptorWrite_1.descriptorCount = 0;
    descriptorWrite_1.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    descriptorWrite_1.pImageInfo = (VkDescriptorImageInfo *)&descriptorWrite_1.pTexelBufferView;
    descriptorWrite_1.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
    (*vk->_vptr_DeviceInterface[0x3e])
              (vk,buffers.
                  super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1,&local_3f0,0,0);
  }
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
      INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    sVar6 = std::vector<int,_std::allocator<int>_>::size(this->m_readIndices);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar6 << 5);
    for (dst._4_4_ = 0; dst._4_4_ < 4; dst._4_4_ = dst._4_4_ + 1) {
      __first = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(dst._4_4_ << 5));
      pvStack_400 = __first;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (this->m_readIndices,(long)dst._4_4_);
      std::fill<int*,int>(__first,__first + 0x20,pvVar11);
    }
    for (local_404 = 0; local_404 < 4; local_404 = local_404 + 1) {
      pvStack_410 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(local_404 << 5));
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)
                 &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffbf0);
    }
  }
  for (local_414 = 0; local_414 < 4; local_414 = local_414 + 1) {
    executor.
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data._8_8_ =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                    (long)(local_414 << 5));
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)&descriptorType,
               (value_type *)
               &executor.
                super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                .m_data.field_0x8);
  }
  pCVar21 = (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context;
  shaderType = (this->super_OpaqueTypeIndexingTestInstance).m_shaderType;
  shaderSpec = (this->super_OpaqueTypeIndexingTestInstance).m_shaderSpec;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)
                       &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                        deleter.m_allocator);
  local_438 = pHVar16->m_internal;
  pSVar17 = createExecutor(pCVar21,shaderType,shaderSpec,(VkDescriptorSetLayout)local_438);
  de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>::DefaultDeleter(&local_439);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
               *)local_430,pSVar17);
  pSVar17 = de::details::
            UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            ::operator->((UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          *)local_430);
  bVar4 = std::vector<void_*,_std::allocator<void_*>_>::empty
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar4) {
    local_700 = (reference)0x0;
  }
  else {
    local_700 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)
                           &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
  }
  ppvVar18 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                       ((vector<void_*,_std::allocator<void_*>_> *)&descriptorType,0);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx);
  _readNdx_3 = pHVar13->m_internal;
  (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17,0x20,local_700,ppvVar18,_readNdx_3);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                *)local_430);
  for (refValue = 0; (int)refValue < 0x20; refValue = refValue + 1) {
    for (resValue = 0; (int)resValue < 4; resValue = resValue + 1) {
      this_02 = this->m_inValues;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (this->m_readIndices,(long)(int)resValue);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this_02,(long)*pvVar11);
      local_454 = *pvVar9;
      pvVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                           (long)(int)(resValue * 0x20 + refValue));
      local_458 = *pvVar19;
      if (local_454 != local_458) {
        tcu::TestLog::operator<<(&local_5d8,local_58,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar20 = tcu::MessageBuilder::operator<<(&local_5d8,(char (*) [22])"ERROR: at invocation ")
        ;
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(int *)&refValue);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [8])", read ");
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(int *)&resValue);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [12])0x132e8f0);
        local_5e0 = tcu::toHex<unsigned_int>(local_454);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_5e0);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(char (*) [7])0x134ad58);
        local_5e8 = tcu::toHex<unsigned_int>(local_458);
        pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,&local_5e8);
        tcu::MessageBuilder::operator<<(pMVar20,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5d8);
        qVar5 = tcu::TestStatus::getCode(__return_storage_ptr__);
        if (qVar5 == QP_TEST_RESULT_PASS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_630,"Invalid result value",&local_631);
          tcu::TestStatus::fail(&local_610,&local_630);
          tcu::TestStatus::operator=(__return_storage_ptr__,&local_610);
          tcu::TestStatus::~TestStatus(&local_610);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator(&local_631);
        }
      }
    }
  }
  local_59 = 1;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferNdx);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  de::details::
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  ::~MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                 m_allocator);
  std::
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  ::~vector((vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
             *)local_100);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)&descriptorType);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((local_59 & 1) == 0) {
    tcu::TestStatus::~TestStatus(__return_storage_ptr__);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BlockArrayIndexingCaseInstance::iterate (void)
{
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numReads			= NUM_READS;
	std::vector<deUint32>		outValues			(numInvocations*numReads);

	tcu::TestLog&				log					= m_context.getTestContext().getLog();
	tcu::TestStatus				testResult			= tcu::TestStatus::pass("Pass");

	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	const VkBufferUsageFlags	bufferUsage			= m_blockType == BLOCKTYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
	const VkDescriptorType		descriptorType		= m_blockType == BLOCKTYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	vector<BufferSp>			buffers				(m_inValues.size());
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(descriptorType);

	for (size_t bufferNdx = 0; bufferNdx < m_inValues.size(); ++bufferNdx)
	{
		buffers[bufferNdx] = BufferSp(new Buffer(m_context, bufferUsage, sizeof(deUint32)));
		*(deUint32*)buffers[bufferNdx]->getHostPtr() = m_inValues[bufferNdx];
		buffers[bufferNdx]->flush();
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numReads, &m_readIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,							descriptorType,						(deUint32)m_inValues.size(),	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ (deUint32)m_inValues.size(),	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,								VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ descriptorType,						(deUint32)m_inValues.size()	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,							}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		vector<VkDescriptorBufferInfo>	bufferInfos			(m_inValues.size());
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			(deUint32)m_inValues.size(),
			descriptorType,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfos[0],
			(const VkBufferView*)DE_NULL,
		};

		for (size_t ndx = 0; ndx < m_inValues.size(); ++ndx)
		{
			bufferInfos[ndx].buffer		= buffers[ndx]->getBuffer();
			bufferInfos[ndx].offset		= 0u;
			bufferInfos[ndx].range		= VK_WHOLE_SIZE;
		}

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			(deUint32)m_inValues.size(),	// dstBinding
			0u,								// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_readIndices.size());

		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			int* dst = &expandedIndices[numInvocations*readNdx];
			std::fill(dst, dst+numInvocations, m_readIndices[readNdx]);
		}

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			inputs.push_back(&expandedIndices[readNdx*numInvocations]);
	}

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		outputs.push_back(&outValues[readNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= m_inValues[m_readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
					<< ", read " << readNdx << ": expected "
					<< tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid result value");
			}
		}
	}

	return testResult;
}